

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

string * __thiscall position::to_fen_abi_cxx11_(string *__return_storage_ptr__,position *this)

{
  char __lhs;
  bool bVar1;
  Piece PVar2;
  Color CVar3;
  int iVar4;
  const_reference pvVar5;
  char *local_240;
  Piece local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [8];
  string half_mvs;
  undefined1 local_1a0 [8];
  string mv50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  Square local_154;
  string local_150;
  Square local_12c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  allocator<char> local_101;
  undefined1 local_100 [8];
  string ep_sq;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  allocator<char> local_b1;
  undefined1 local_b0 [8];
  string c_str;
  Square local_6c;
  Square local_68;
  Square local_64;
  string local_60;
  Square local_40;
  Square local_3c;
  int local_38;
  int s;
  int c;
  int empties;
  int r;
  allocator<char> local_1a;
  byte local_19;
  position *local_18;
  position *this_local;
  string *fen;
  
  local_19 = 0;
  local_18 = this;
  this_local = (position *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  for (c = 7; -1 < c; c = c + -1) {
    s = 0;
    for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
      local_40 = local_38 + c * 8;
      local_3c = local_40;
      PVar2 = piece_on(this,&local_40);
      if (PVar2 == no_piece) {
        s = s + 1;
      }
      else {
        if (0 < s) {
          std::__cxx11::to_string(&local_60,s);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(__return_storage_ptr__,&local_60);
          std::__cxx11::string::~string((string *)&local_60);
        }
        s = 0;
        local_64 = local_3c;
        CVar3 = color_on(this,&local_64);
        if (CVar3 == black) {
          local_68 = local_3c;
          local_230 = piece_on(this,&local_68);
          local_230 = local_230 + pieces;
        }
        else {
          local_6c = local_3c;
          local_230 = piece_on(this,&local_6c);
        }
        pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                           (&SanPiece,(long)(int)local_230);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__,*pvVar5);
      }
    }
    if (0 < s) {
      std::__cxx11::to_string((string *)((long)&c_str.field_2 + 8),s);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&c_str.field_2 + 8));
      std::__cxx11::string::~string((string *)(c_str.field_2._M_local_buf + 8));
    }
    if (0 < c) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,"/");
    }
  }
  CVar3 = to_move(this);
  if (CVar3 == white) {
    local_240 = " w";
  }
  else {
    local_240 = " b";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,local_240);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,"",&local_b1);
  std::allocator<char>::~allocator(&local_b1);
  if (((this->ifo).cmask & 1) == 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,"K");
  }
  if (((this->ifo).cmask & 2) == 2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,"Q");
  }
  if (((this->ifo).cmask & 4) == 4) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,"k");
  }
  if (((this->ifo).cmask & 8) == 8) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,"q");
  }
  ep_sq.field_2._M_local_buf[0xe] = '\0';
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b0,"");
  if (bVar1) {
    std::allocator<char>::allocator();
    ep_sq.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8," -",(allocator<char> *)(ep_sq.field_2._M_local_buf + 0xf));
  }
  else {
    std::operator+(&local_d8," ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  if ((ep_sq.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(ep_sq.field_2._M_local_buf + 0xf));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_100,"",&local_101);
  std::allocator<char>::~allocator(&local_101);
  if ((this->ifo).eps != no_square) {
    local_12c = (this->ifo).eps;
    iVar4 = util::col((int *)&local_12c);
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](&SanCols,(long)iVar4);
    __lhs = *pvVar5;
    local_154 = (this->ifo).eps;
    iVar4 = util::row((int *)&local_154);
    std::__cxx11::to_string(&local_150,iVar4 + 1);
    std::operator+(&local_128,__lhs,&local_150);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
               &local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_150);
  }
  mv50.field_2._M_local_buf[0xe] = '\0';
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_100,"");
  if (bVar1) {
    std::allocator<char>::allocator();
    mv50.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178," -",(allocator<char> *)(mv50.field_2._M_local_buf + 0xf));
  }
  else {
    std::operator+(&local_178," ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  if ((mv50.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(mv50.field_2._M_local_buf + 0xf));
  }
  std::__cxx11::to_string((string *)local_1a0,(uint)(this->ifo).move50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&half_mvs.field_2 + 8)," ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&half_mvs.field_2 + 8));
  std::__cxx11::string::~string((string *)(half_mvs.field_2._M_local_buf + 8));
  std::__cxx11::to_string((string *)local_1e0,(uint)(this->ifo).hmvs);
  std::operator+(&local_200," ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  local_19 = 1;
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_b0);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string position::to_fen() const {
	std::string fen = "";
	for (int r = 7; r >= 0; --r) {
		int empties = 0;

		for (int c = 0; c < 8; ++c) {
			int s = r * 8 + c;
			if (piece_on(Square(s)) == no_piece) { ++empties; continue; }
			if (empties > 0) fen += std::to_string(empties);
			empties = 0;

			fen += SanPiece[(color_on(Square(s)) == black ?
				piece_on(Square(s)) + 6 : piece_on(Square(s)))];
		}

		if (empties > 0) fen += std::to_string(empties);
		if (r > 0) fen += "/";
	}

	fen += (to_move() == white ? " w" : " b");

	// castle rights
	std::string c_str = "";
	if ((ifo.cmask & wks) == wks) c_str += "K";
	if ((ifo.cmask & wqs) == wqs) c_str += "Q";
	if ((ifo.cmask & bks) == bks) c_str += "k";
	if ((ifo.cmask & bqs) == bqs) c_str += "q";
	fen += (c_str == "" ? " -" : " " + c_str);

	// ep-square
	std::string ep_sq = "";
	if (ifo.eps != no_square) {
		ep_sq += SanCols[util::col(ifo.eps)] + std::to_string(util::row(ifo.eps) + 1);
	}
	fen += (ep_sq == "" ? " -" : " " + ep_sq);

	// move50
	std::string mv50 = std::to_string(ifo.move50);
	fen += " " + mv50;

	// half-mvs
	std::string half_mvs = std::to_string(ifo.hmvs);
	fen += " " + half_mvs;

	return fen;
}